

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O2

int __thiscall hwnet::Poller::notifyChannel::init(notifyChannel *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  int iVar2;
  Ptr local_48;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  iVar1 = pipe2(this->notifyfds,0x80800);
  iVar2 = iVar1;
  if (iVar1 == 0) {
    std::__shared_ptr<hwnet::Poller::notifyChannel,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::Poller::notifyChannel,void>
              ((__shared_ptr<hwnet::Poller::notifyChannel,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (__weak_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::Poller::notifyChannel>);
    local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
    local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_30._M_pi;
    local_38 = (element_type *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Add((Poller *)ctx,&local_48,2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
    iVar2 = extraout_EAX;
  }
  return CONCAT31((int3)((uint)iVar2 >> 8),iVar1 == 0);
}

Assistant:

bool Poller::notifyChannel::init(Poller *p) {

#ifdef _LINUX
	if(pipe2(this->notifyfds,O_NONBLOCK | O_CLOEXEC) != 0) {
	    return false;	
	}
#elif _MACOS
	if(pipe(this->notifyfds) != 0){
		return false;
	}
	
	SetNoBlock(this->notifyfds[0],true);
	SetCloseOnExec(this->notifyfds[0]);

	SetNoBlock(this->notifyfds[1],true);
	SetCloseOnExec(this->notifyfds[1]);

#endif

	p->Add(shared_from_this(),Read);

	return true;	
}